

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffhdef(fitsfile *fptr,int morekeys,int *status)

{
  FITSfile *pFVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = *status;
  if (0 < morekeys && iVar3 < 1) {
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if (fptr->Fptr->datastart == -1) {
        ffrdef(fptr,status);
        pFVar1 = fptr->Fptr;
        lVar4 = ((long)((ulong)(uint)(morekeys * 0x50) + pFVar1->headend) / 0xb40) * 0xb40 + 0xb40;
        lVar2 = pFVar1->datastart;
        pFVar1->datastart = lVar4;
        pFVar1->headstart[(long)pFVar1->curhdu + 1] =
             pFVar1->headstart[(long)pFVar1->curhdu + 1] + (lVar4 - lVar2);
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int ffhdef(fitsfile *fptr,      /* I - FITS file pointer                    */
           int morekeys,        /* I - reserve space for this many keywords */
           int *status)         /* IO - error status                        */
/*
  based on the number of keywords which have already been written,
  plus the number of keywords to reserve space for, we then can
  define where the data unit should start (it must start at the
  beginning of a 2880-byte logical block).

  This routine will only have any effect if the starting location of the
  data unit following the header is not already defined.  In any case,
  it is always possible to add more keywords to the header even if the
  data has already been written.  It is just more efficient to reserve
  the space in advance.
*/
{
    LONGLONG delta;

    if (*status > 0 || morekeys < 1)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
      ffrdef(fptr, status);

      /* ffrdef defines the offset to datastart and the start of */
      /* the next HDU based on the number of existing keywords. */
      /* We need to increment both of these values based on */
      /* the number of new keywords to be added.  */

      delta = (((fptr->Fptr)->headend + (morekeys * 80)) / 2880 + 1)
                                * 2880 - (fptr->Fptr)->datastart; 
              
      (fptr->Fptr)->datastart += delta;

      (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] += delta;

    }
    return(*status);
}